

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O3

Reals __thiscall Omega_h::repeat_vector<1>(Omega_h *this,LO n,Vector<1> v)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar4;
  Reals RVar5;
  Write<double> vs;
  type f;
  Write<double> local_68;
  Write<double> local_50;
  string local_40;
  Few<double,_1> local_20;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_20.array_[0] = (double  [1])(double  [1])v.super_Few<double,_1>.array_[0];
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  Write<double>::Write(&local_68,n,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_40._M_dataplus._M_p = (pointer)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40._M_string_length = (size_type)local_68.shared_alloc_.direct_ptr;
  local_40.field_2._M_allocated_capacity = (size_type)local_20.array_[0];
  parallel_for<Omega_h::repeat_vector<1>(int,Omega_h::Vector<1>)::_lambda(int)_1_>
            (n,(type *)&local_40,"repeat_vector");
  local_50.shared_alloc_.alloc = local_68.shared_alloc_.alloc;
  local_50.shared_alloc_.direct_ptr = local_68.shared_alloc_.direct_ptr;
  if ((((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
       local_68.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + -1;
    local_50.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_68.shared_alloc_.alloc = (Alloc *)0x0;
  local_68.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,&local_50);
  pAVar2 = local_50.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_50.shared_alloc_.alloc & 7) == 0 && local_50.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_50.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  _Var3._M_p = local_40._M_dataplus._M_p;
  if (((ulong)local_40._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_40._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_40._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_40._M_dataplus._M_p);
      operator_delete(_Var3._M_p,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  pAVar2 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  RVar5.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals repeat_vector(LO n, Vector<dim> v) {
  Write<Real> vs(n * dim);
  auto f = OMEGA_H_LAMBDA(LO i) { set_vector(vs, i, v); };
  parallel_for(n, f, "repeat_vector");
  return vs;
}